

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O2

void anon_unknown.dwarf_1f38a46::FillEdge<unsigned_char>
               (ACMRandom *rnd,int num_pixels,int bd,bool trash,uchar *data)

{
  uint16_t uVar1;
  undefined7 in_register_00000009;
  ulong uVar2;
  ulong uVar3;
  
  if ((int)CONCAT71(in_register_00000009,trash) != 0) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)num_pixels;
    if (num_pixels < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = libaom_test::ACMRandom::Rand16(rnd);
      data[uVar2] = (byte)uVar1 & ~(byte)(-1 << ((byte)bd & 0x1f));
    }
    return;
  }
  memset(data,0,(long)num_pixels);
  return;
}

Assistant:

void FillEdge(ACMRandom *rnd, int num_pixels, int bd, bool trash, Pixel *data) {
  if (!trash) {
    memset(data, 0, sizeof(*data) * num_pixels);
    return;
  }
  const Pixel mask = (1 << bd) - 1;
  for (int i = 0; i < num_pixels; ++i) data[i] = rnd->Rand16() & mask;
}